

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

bool matches_objectName_non_null(QObject *obj,QAnyStringView name)

{
  _func_int **pp_Var1;
  bool bVar2;
  long in_FS_OFFSET;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_28;
  ulong local_20;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_18;
  size_t local_10;
  long local_8;
  
  local_10 = name.m_size;
  local_18 = name.field_0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pp_Var1 = (obj->d_ptr).d[1]._vptr_QObjectData;
  if (pp_Var1 == (_func_int **)0x0) {
    bVar2 = ((undefined1  [16])name & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0
    ;
  }
  else {
    local_20 = (ulong)pp_Var1[0xe] | 0x8000000000000000;
    local_28 = *(anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(pp_Var1 + 0xd);
    bVar2 = comparesEqual((QAnyStringView *)&local_28,(QAnyStringView *)&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool matches_objectName_non_null(QObject *obj, QAnyStringView name)
{
    if (auto ext = QObjectPrivate::get(obj)->extraData)
        return ext ->objectName.valueBypassingBindings() == name;
    return name.isEmpty();
}